

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  string *psVar4;
  Message *pMVar5;
  undefined4 extraout_var;
  MessageLite *this_00;
  LogMessage *pLVar6;
  UnknownFieldSet *pUVar7;
  UnknownFieldSet *group;
  LogMessage local_288;
  undefined1 local_250 [8];
  string serial;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c8 [8];
  Parser parser;
  AggregateOptionFinder finder;
  AggregateErrorCollector collector;
  string local_168;
  byte local_141;
  LogMessage local_140;
  scoped_ptr<google::protobuf::Message> local_108;
  scoped_ptr<google::protobuf::Message> dynamic;
  Descriptor *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  UnknownFieldSet *local_28;
  UnknownFieldSet *unknown_fields_local;
  FieldDescriptor *option_field_local;
  OptionInterpreter *this_local;
  
  local_28 = unknown_fields;
  unknown_fields_local = (UnknownFieldSet *)option_field;
  option_field_local = (FieldDescriptor *)this;
  bVar1 = UninterpretedOption::has_aggregate_value(this->uninterpreted_option_);
  if (bVar1) {
    dynamic.ptr_ = (Message *)FieldDescriptor::message_type((FieldDescriptor *)unknown_fields_local)
    ;
    pMVar5 = DynamicMessageFactory::GetPrototype(&this->dynamic_factory_,(Descriptor *)dynamic.ptr_)
    ;
    iVar2 = (*(pMVar5->super_MessageLite)._vptr_MessageLite[3])();
    internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
              (&local_108,(Message *)CONCAT44(extraout_var,iVar2));
    local_141 = 0;
    collector.error_.field_2._M_local_buf[0xf] = '\0';
    pMVar5 = internal::scoped_ptr<google::protobuf::Message>::get(&local_108);
    if (pMVar5 == (Message *)0x0) {
      internal::LogMessage::LogMessage
                (&local_140,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x1995);
      local_141 = 1;
      pLVar6 = internal::LogMessage::operator<<(&local_140,"CHECK failed: dynamic.get() != NULL: ");
      pLVar6 = internal::LogMessage::operator<<(pLVar6,"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_(&local_168,(FieldDescriptor *)unknown_fields_local);
      collector.error_.field_2._M_local_buf[0xf] = '\x01';
      pLVar6 = internal::LogMessage::operator<<(pLVar6,&local_168);
      internal::LogFinisher::operator=
                ((LogFinisher *)(collector.error_.field_2._M_local_buf + 0xe),pLVar6);
    }
    if ((collector.error_.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_168);
    }
    if ((local_141 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_140);
    }
    anon_unknown_1::AggregateErrorCollector::AggregateErrorCollector
              ((AggregateErrorCollector *)&finder.builder_);
    AggregateOptionFinder::AggregateOptionFinder((AggregateOptionFinder *)&parser.allow_partial_);
    finder.super_Finder._vptr_Finder = (_func_int **)this->builder_;
    TextFormat::Parser::Parser((Parser *)local_1c8);
    TextFormat::Parser::RecordErrorsTo((Parser *)local_1c8,(ErrorCollector *)&finder.builder_);
    TextFormat::Parser::SetFinder((Parser *)local_1c8,(Finder *)&parser.allow_partial_);
    psVar4 = UninterpretedOption::aggregate_value_abi_cxx11_(this->uninterpreted_option_);
    pMVar5 = internal::scoped_ptr<google::protobuf::Message>::get(&local_108);
    bVar1 = TextFormat::Parser::ParseFromString((Parser *)local_1c8,psVar4,pMVar5);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_250);
      this_00 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_108)->
                 super_MessageLite;
      MessageLite::SerializeToString(this_00,(string *)local_250);
      TVar3 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
      pUVar7 = local_28;
      if (TVar3 == TYPE_MESSAGE) {
        iVar2 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
        UnknownFieldSet::AddLengthDelimited(pUVar7,iVar2,(string *)local_250);
      }
      else {
        group._7_1_ = 0;
        TVar3 = FieldDescriptor::type((FieldDescriptor *)unknown_fields_local);
        if (TVar3 != TYPE_GROUP) {
          internal::LogMessage::LogMessage
                    (&local_288,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                     ,0x19a9);
          group._7_1_ = 1;
          pLVar6 = internal::LogMessage::operator<<
                             (&local_288,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)((long)&group + 6),pLVar6);
        }
        if ((group._7_1_ & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_288);
        }
        pUVar7 = local_28;
        iVar2 = FieldDescriptor::number((FieldDescriptor *)unknown_fields_local);
        pUVar7 = UnknownFieldSet::AddGroup(pUVar7,iVar2);
        UnknownFieldSet::ParseFromString(pUVar7,(string *)local_250);
      }
      this_local._7_1_ = 1;
      serial.field_2._12_4_ = 1;
      std::__cxx11::string::~string((string *)local_250);
    }
    else {
      psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
      std::operator+(&local_228,"Error while parsing option value for \"",psVar4);
      std::operator+(&local_208,&local_228,"\": ");
      std::operator+(&local_1e8,&local_208,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&collector
                    );
      AddValueError(this,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      this_local._7_1_ = 0;
      serial.field_2._12_4_ = 1;
    }
    TextFormat::Parser::~Parser((Parser *)local_1c8);
    AggregateOptionFinder::~AggregateOptionFinder((AggregateOptionFinder *)&parser.allow_partial_);
    anon_unknown_1::AggregateErrorCollector::~AggregateErrorCollector
              ((AggregateErrorCollector *)&finder.builder_);
    internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr(&local_108);
  }
  else {
    psVar4 = FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
    std::operator+(&local_e8,"Option \"",psVar4);
    std::operator+(&local_c8,&local_e8,
                   "\" is a message. To set the entire message, use syntax like \"");
    psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
    std::operator+(&local_a8,&local_c8,psVar4);
    std::operator+(&local_88,&local_a8,
                   " = { <proto text format> }\". To set fields within it, use syntax like \"");
    psVar4 = FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)unknown_fields_local);
    std::operator+(&local_68,&local_88,psVar4);
    std::operator+(&local_48,&local_68,".foo = value\".");
    this_local._7_1_ = AddValueError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" + option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" + option_field->name() +
                         ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  google::protobuf::scoped_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != NULL)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(),  FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}